

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *this_00;
  bool bVar2;
  ostream *poVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string line;
  string fileList;
  ifstream finList;
  string local_268;
  string local_248;
  undefined1 local_228 [16];
  undefined8 local_218;
  char *local_210;
  ios_base local_1b8 [408];
  
  cmCTest::GetBinaryDir_abi_cxx11_(&local_268,(this->super_cmCTestGenericHandler).CTest);
  local_228._0_8_ = local_268._M_string_length;
  local_228._8_8_ = local_268._M_dataplus._M_p;
  local_218 = 0x21;
  local_210 = "/CMakeFiles/TargetDirectories.txt";
  views._M_len = 2;
  views._M_array = (iterator)local_228;
  cmCatViews_abi_cxx11_(&local_248,views);
  paVar1 = &local_268.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_228," target directory list [",0x18);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_228,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\n",2);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x8b3,local_268._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  std::ifstream::ifstream(local_228,local_248._M_dataplus._M_p,_S_in);
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_268._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)local_228,&local_268,(bool *)0x0,0xffffffffffffffff);
    if (!bVar2) break;
    LoadLabels(this,local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels()
{
  std::string fileList =
    cmStrCat(this->CTest->GetBinaryDir(), "/CMakeFiles/TargetDirectories.txt");
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " target directory list [" << fileList << "]\n",
                     this->Quiet);
  cmsys::ifstream finList(fileList.c_str());
  std::string line;
  while (cmSystemTools::GetLineFromStream(finList, line)) {
    this->LoadLabels(line.c_str());
  }
}